

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

IVec4 __thiscall tcu::getFormatMaxIntValue(tcu *this,TextureFormat *format)

{
  ChannelOrder CVar1;
  ChannelType CVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  IVec4 IVar7;
  
  CVar1 = format->order;
  CVar2 = format->type;
  IVar7.m_data[2]._0_1_ = (CVar1 == BGRA || CVar1 == RGBA) && CVar2 == SIGNED_INT_1010102_REV;
  IVar7.m_data[2]._1_3_ = (int3)(CVar1 >> 8);
  if ((CVar1 == BGRA || CVar1 == RGBA) && CVar2 == SIGNED_INT_1010102_REV) {
    uVar3 = 0x1ff;
    uVar4 = 0x1ff;
    uVar5 = 0x1ff;
    uVar6 = 1;
  }
  else if (CVar2 == SIGNED_INT8) {
    uVar3 = 0x7f;
    uVar4 = 0x7f;
    uVar5 = 0x7f;
    uVar6 = 0x7f;
  }
  else if (CVar2 == SIGNED_INT16) {
    uVar3 = 0x7fff;
    uVar4 = 0x7fff;
    uVar5 = 0x7fff;
    uVar6 = 0x7fff;
  }
  else if (CVar2 == SIGNED_INT32) {
    uVar3 = 0x7fffffff;
    uVar4 = 0x7fffffff;
    uVar5 = 0x7fffffff;
    uVar6 = 0x7fffffff;
  }
  else {
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    uVar6 = 0;
  }
  *(undefined4 *)this = uVar3;
  *(undefined4 *)(this + 4) = uVar4;
  *(undefined4 *)(this + 8) = uVar5;
  *(undefined4 *)(this + 0xc) = uVar6;
  IVar7.m_data._0_8_ = this;
  IVar7.m_data[3] = 0;
  return (IVec4)IVar7.m_data;
}

Assistant:

IVec4 getFormatMaxIntValue (const TextureFormat& format)
{
	DE_ASSERT(getTextureChannelClass(format.type) == TEXTURECHANNELCLASS_SIGNED_INTEGER);

	if (format == TextureFormat(TextureFormat::RGBA, TextureFormat::SIGNED_INT_1010102_REV) ||
		format == TextureFormat(TextureFormat::BGRA, TextureFormat::SIGNED_INT_1010102_REV))
		return IVec4(511, 511, 511, 1);

	switch (format.type)
	{
		case TextureFormat::SIGNED_INT8:	return IVec4(std::numeric_limits<deInt8>::max());
		case TextureFormat::SIGNED_INT16:	return IVec4(std::numeric_limits<deInt16>::max());
		case TextureFormat::SIGNED_INT32:	return IVec4(std::numeric_limits<deInt32>::max());

		default:
			DE_FATAL("Invalid channel type");
			return IVec4(0);
	}
}